

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

parser_error parse_curse_effect_yx(parser *p)

{
  long *plVar1;
  wchar_t wVar2;
  void *pvVar3;
  long *plVar4;
  parser_error pVar5;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar5 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    plVar1 = *(long **)(*(long *)((long)pvVar3 + 0x18) + 0x100);
    pVar5 = PARSE_ERROR_NONE;
    if (plVar1 != (long *)0x0) {
      do {
        plVar4 = plVar1;
        plVar1 = (long *)*plVar4;
      } while ((long *)*plVar4 != (long *)0x0);
      wVar2 = parser_getint(p,"y");
      *(wchar_t *)(plVar4 + 3) = wVar2;
      wVar2 = parser_getint(p,"x");
      *(wchar_t *)((long)plVar4 + 0x1c) = wVar2;
    }
  }
  return pVar5;
}

Assistant:

static enum parser_error parse_curse_effect_yx(struct parser *p) {
	struct curse *curse = parser_priv(p);
	struct effect *effect;

	if (!curse) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/* If there is no effect, assume that this is human and not parser error. */
	effect = curse->obj->effect;
	if (effect == NULL) {
		return PARSE_ERROR_NONE;
	}
	while (effect->next) effect = effect->next;
	effect->y = parser_getint(p, "y");
	effect->x = parser_getint(p, "x");
	return PARSE_ERROR_NONE;
}